

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UBool __thiscall icu_63::UnicodeSet::contains(UnicodeSet *this,UChar32 c)

{
  BMPSet *pBVar1;
  byte bVar2;
  int iVar3;
  int32_t iVar4;
  UnicodeSet *this_00;
  undefined8 in_RDX;
  
  do {
    this_00 = this;
    pBVar1 = this_00->bmpSet;
    if (pBVar1 != (BMPSet *)0x0) {
      iVar3 = (*pBVar1->_vptr_BMPSet[2])(pBVar1,c,in_RDX,pBVar1->_vptr_BMPSet[2]);
      return (UBool)iVar3;
    }
    this = &this_00->stringSpan->spanSet;
  } while (this_00->stringSpan != (UnicodeSetStringSpan *)0x0);
  if (c < 0x110000) {
    iVar4 = findCodePoint(this_00,c);
    bVar2 = (byte)iVar4 & 1;
  }
  else {
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

UBool UnicodeSet::contains(UChar32 c) const {
    // Set i to the index of the start item greater than ch
    // We know we will terminate without length test!
    // LATER: for large sets, add binary search
    //int32_t i = -1;
    //for (;;) {
    //    if (c < list[++i]) break;
    //}
    if (bmpSet != NULL) {
        return bmpSet->contains(c);
    }
    if (stringSpan != NULL) {
        return stringSpan->contains(c);
    }
    if (c >= UNICODESET_HIGH) { // Don't need to check LOW bound
        return FALSE;
    }
    int32_t i = findCodePoint(c);
    return (UBool)(i & 1); // return true if odd
}